

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

void __thiscall
RigidBodyDynamics::Model::SetQuaternion(Model *this,uint i,Quaternion *quat,VectorNd *Q)

{
  double dVar1;
  CoeffReturnType pdVar2;
  Scalar *pSVar3;
  uint in_ESI;
  long in_RDI;
  uint q_index;
  Index in_stack_ffffffffffffffa8;
  double index;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *in_stack_ffffffffffffffb0;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *this_00;
  
  std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
  operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
              *)(in_RDI + 0xa0),(ulong)in_ESI);
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  index = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                      in_stack_ffffffffffffffb0,(Index)index);
  *pSVar3 = index;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     (in_stack_ffffffffffffffb0,(Index)index);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)*pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar3 = (Scalar)this_00;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)index);
  dVar1 = *pdVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar3 = dVar1;
  pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> *)this_00,
                      (Index)index);
  dVar1 = *pdVar2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1c0),(ulong)in_ESI);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     (this_00,(Index)index);
  *pSVar3 = dVar1;
  return;
}

Assistant:

void SetQuaternion (unsigned int i,
                      const Math::Quaternion &quat,
                      Math::VectorNd &Q) const
  {
    assert (mJoints[i].mJointType == JointTypeSpherical);
    unsigned int q_index = mJoints[i].q_index;

    Q[q_index] = quat[0];
    Q[q_index + 1] = quat[1];
    Q[q_index + 2] = quat[2];
    Q[multdof3_w_index[i]] = quat[3];
  }